

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Soccer.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_af1b0::Player::reset(Player *this)

{
  long lVar1;
  int iVar2;
  float fVar3;
  ulong uVar4;
  undefined8 extraout_XMM0_Qa;
  
  OpenSteer::SimpleVehicle::reset(&this->super_SimpleVehicle);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1c])(0,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x1f])(0x453b8b33,this);
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[0x21])(0x41200000,this);
  fVar3 = 20.0;
  if (this->b_ImTeamA == false) {
    fVar3 = -20.0;
  }
  iVar2 = rand();
  fVar3 = (float)iVar2 * 4.656613e-10 * fVar3;
  iVar2 = rand();
  (this->super_SimpleVehicle).super_SimpleVehicle_3.
  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
  super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._position.x = fVar3;
  (this->super_SimpleVehicle).super_SimpleVehicle_3.
  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
  super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._position.y = 0.0;
  (this->super_SimpleVehicle).super_SimpleVehicle_3.
  super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
  super_LocalSpaceMixin<OpenSteer::AbstractVehicle>._position.z =
       ((float)iVar2 * 4.656613e-10 + -0.5) * 20.0;
  if ((long)this->m_MyID < 9) {
    lVar1 = (long)this->m_MyID * 0xc;
    if (this->b_ImTeamA == true) {
      uVar4 = *(ulong *)((anonymous_namespace)::playerPosition + lVar1);
    }
    else {
      uVar4 = *(ulong *)((anonymous_namespace)::playerPosition + lVar1) ^ 0x80000000;
    }
    fVar3 = *(float *)((anonymous_namespace)::playerPosition + lVar1 + 8);
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[9])(uVar4,this);
  }
  (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
    super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
    super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.super_AbstractLocalSpace
    ._vptr_AbstractLocalSpace[8])(this);
  (this->m_home).x = (float)(int)extraout_XMM0_Qa;
  (this->m_home).y = (float)(int)((ulong)extraout_XMM0_Qa >> 0x20);
  (this->m_home).z = fVar3;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  setTrailParameters((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,(this->super_SimpleVehicle).super_SimpleVehicle_3.
                          super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>
                          .trailDuration,
                     (this->super_SimpleVehicle).super_SimpleVehicle_3.
                     super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
                     trailVertexCount);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  setTrailParameters((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,10.0,0x3c);
  return;
}

Assistant:

void reset (void)
        {
            SimpleVehicle::reset (); // reset the vehicle 
            setSpeed (0.0f);         // speed along Forward direction.
            setMaxForce (3000.7f);      // steering force is clipped to this magnitude
            setMaxSpeed (10);         // velocity is clipped to this magnitude

            // Place me on my part of the field, looking at oponnents goal
            setPosition(b_ImTeamA ? frandom01()*20 : -frandom01()*20, 0, (frandom01()-0.5f)*20);
            if(m_MyID < 9)
                {
                if(b_ImTeamA)
                    setPosition(playerPosition[m_MyID]);
                else
                    setPosition(Vec3(-playerPosition[m_MyID].x, playerPosition[m_MyID].y, playerPosition[m_MyID].z));
                }
            m_home = position();
            clearTrailHistory ();    // prevent long streaks due to teleportation 
            setTrailParameters (10, 60);
        }